

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

uint32_t __thiscall xatlas::internal::Mesh::findEdge(Mesh *this,uint32_t vertex0,uint32_t vertex1)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t v1;
  bool local_66;
  uint32_t local_54;
  uint32_t edge_1;
  EdgeKey key_1;
  ColocalVertexIterator it1;
  ColocalVertexIterator it0;
  uint32_t edge;
  EdgeKey key;
  uint32_t result;
  uint32_t vertex1_local;
  uint32_t vertex0_local;
  Mesh *this_local;
  
  key.v0 = 0xffffffff;
  bVar1 = Array<unsigned_int>::isEmpty(&this->m_nextColocalVertex);
  if (bVar1) {
    EdgeKey::EdgeKey((EdgeKey *)&it0.m_current,vertex0,vertex1);
    for (it0.m_first = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
                       ::get(&this->m_edgeMap,(EdgeKey *)&it0.m_current); it0.m_first != 0xffffffff;
        it0.m_first = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
                      ::getNext(&this->m_edgeMap,it0.m_first)) {
      uVar2 = meshEdgeFace(it0.m_first);
      bVar1 = isFaceIgnored(this,uVar2);
      if (!bVar1) {
        key.v0 = it0.m_first;
      }
    }
  }
  else {
    ColocalVertexIterator::ColocalVertexIterator((ColocalVertexIterator *)&it1.m_first,this,vertex0)
    ;
    while (bVar1 = ColocalVertexIterator::isDone((ColocalVertexIterator *)&it1.m_first),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      ColocalVertexIterator::ColocalVertexIterator((ColocalVertexIterator *)&key_1,this,vertex1);
      while (bVar1 = ColocalVertexIterator::isDone((ColocalVertexIterator *)&key_1),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        uVar2 = ColocalVertexIterator::vertex((ColocalVertexIterator *)&it1.m_first);
        v1 = ColocalVertexIterator::vertex((ColocalVertexIterator *)&key_1);
        EdgeKey::EdgeKey((EdgeKey *)&stack0xffffffffffffffb0,uVar2,v1);
        for (local_54 = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
                        ::get(&this->m_edgeMap,(EdgeKey *)&stack0xffffffffffffffb0);
            local_54 != 0xffffffff;
            local_54 = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
                       ::getNext(&this->m_edgeMap,local_54)) {
          uVar2 = meshEdgeFace(local_54);
          bVar1 = isFaceIgnored(this,uVar2);
          if (!bVar1) {
            local_66 = true;
            if (this->m_id == 0xffffffff) {
              local_66 = this->m_id == 0xffffffff && key.v0 == 0xffffffff;
            }
            if (!local_66) {
              __assert_fail("m_id != (4294967295U) || (m_id == (4294967295U) && result == (4294967295U))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                            ,0xacf,
                            "uint32_t xatlas::internal::Mesh::findEdge(uint32_t, uint32_t) const");
            }
            key.v0 = local_54;
          }
        }
        ColocalVertexIterator::advance((ColocalVertexIterator *)&key_1);
      }
      ColocalVertexIterator::advance((ColocalVertexIterator *)&it1.m_first);
    }
  }
  return key.v0;
}

Assistant:

uint32_t findEdge(uint32_t vertex0, uint32_t vertex1) const
	{
		uint32_t result = UINT32_MAX;
		if (m_nextColocalVertex.isEmpty()) {
			EdgeKey key(vertex0, vertex1);
			uint32_t edge = m_edgeMap.get(key);
			while (edge != UINT32_MAX) {
				// Don't find edges of ignored faces.
				if (!isFaceIgnored(meshEdgeFace(edge))) {
					//XA_DEBUG_ASSERT(m_id != UINT32_MAX || (m_id == UINT32_MAX && result == UINT32_MAX)); // duplicate edge - ignore on initial meshes
					result = edge;
#if !XA_DEBUG
					return result;
#endif
				}
				edge = m_edgeMap.getNext(edge);
			}
		} else {
			for (ColocalVertexIterator it0(this, vertex0); !it0.isDone(); it0.advance()) {
				for (ColocalVertexIterator it1(this, vertex1); !it1.isDone(); it1.advance()) {
					EdgeKey key(it0.vertex(), it1.vertex());
					uint32_t edge = m_edgeMap.get(key);
					while (edge != UINT32_MAX) {
						// Don't find edges of ignored faces.
						if (!isFaceIgnored(meshEdgeFace(edge))) {
							XA_DEBUG_ASSERT(m_id != UINT32_MAX || (m_id == UINT32_MAX && result == UINT32_MAX)); // duplicate edge - ignore on initial meshes
							result = edge;
#if !XA_DEBUG
							return result;
#endif
						}
						edge = m_edgeMap.getNext(edge);
					}
				}
			}
		}
		return result;
	}